

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O3

OPJ_BOOL opj_mct_encode_custom
                   (OPJ_BYTE *pCodingdata,OPJ_SIZE_T n,OPJ_BYTE **pData,OPJ_UINT32 pNbComp,
                   OPJ_UINT32 isSigned)

{
  void *pvVar1;
  int *piVar2;
  OPJ_BOOL OVar3;
  void *ptr;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  OPJ_SIZE_T OVar7;
  void *pvVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  
  uVar10 = pNbComp * pNbComp;
  ptr = opj_malloc((ulong)(pNbComp + uVar10) << 2);
  if (ptr == (void *)0x0) {
    OVar3 = 0;
  }
  else {
    uVar4 = (ulong)pNbComp;
    pvVar1 = (void *)((long)ptr + uVar4 * 4);
    if (uVar10 != 0) {
      uVar6 = 0;
      do {
        *(int *)((long)pvVar1 + uVar6 * 4) = (int)(*(float *)(pCodingdata + uVar6 * 4) * 8192.0);
        uVar6 = uVar6 + 1;
      } while (uVar10 != uVar6);
    }
    if (n != 0) {
      OVar7 = 0;
      do {
        if (pNbComp != 0) {
          uVar6 = 0;
          do {
            *(undefined4 *)((long)ptr + uVar6 * 4) = *(undefined4 *)pData[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
          if (pNbComp != 0) {
            uVar6 = 0;
            pvVar8 = pvVar1;
            do {
              piVar2 = (int *)pData[uVar6];
              *piVar2 = 0;
              lVar9 = 0;
              iVar5 = 0;
              do {
                lVar11 = (long)*(int *)((long)ptr + lVar9) * (long)*(int *)((long)pvVar8 + lVar9) +
                         0x1000 >> 0xd;
                if (0x7fffffff < lVar11) {
                  __assert_fail("(temp >> 13) <= (OPJ_INT64)0x7FFFFFFF",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/opj_intmath.h"
                                ,0xfa,"OPJ_INT32 opj_int_fix_mul(OPJ_INT32, OPJ_INT32)");
                }
                if (lVar11 < -0x80000000) {
                  __assert_fail("(temp >> 13) >= (-(OPJ_INT64)0x7FFFFFFF - (OPJ_INT64)1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/opj_intmath.h"
                                ,0xfb,"OPJ_INT32 opj_int_fix_mul(OPJ_INT32, OPJ_INT32)");
                }
                iVar5 = iVar5 + (int)lVar11;
                *piVar2 = iVar5;
                lVar9 = lVar9 + 4;
              } while (uVar4 * 4 - lVar9 != 0);
              pData[uVar6] = (OPJ_BYTE *)(piVar2 + 1);
              uVar6 = uVar6 + 1;
              pvVar8 = (void *)((long)pvVar8 + lVar9);
            } while (uVar6 != uVar4);
          }
        }
        OVar7 = OVar7 + 1;
      } while (OVar7 != n);
    }
    opj_free(ptr);
    OVar3 = 1;
  }
  return OVar3;
}

Assistant:

OPJ_BOOL opj_mct_encode_custom(
    OPJ_BYTE * pCodingdata,
    OPJ_SIZE_T n,
    OPJ_BYTE ** pData,
    OPJ_UINT32 pNbComp,
    OPJ_UINT32 isSigned)
{
    OPJ_FLOAT32 * lMct = (OPJ_FLOAT32 *) pCodingdata;
    OPJ_SIZE_T i;
    OPJ_UINT32 j;
    OPJ_UINT32 k;
    OPJ_UINT32 lNbMatCoeff = pNbComp * pNbComp;
    OPJ_INT32 * lCurrentData = 00;
    OPJ_INT32 * lCurrentMatrix = 00;
    OPJ_INT32 ** lData = (OPJ_INT32 **) pData;
    OPJ_UINT32 lMultiplicator = 1 << 13;
    OPJ_INT32 * lMctPtr;

    OPJ_ARG_NOT_USED(isSigned);

    lCurrentData = (OPJ_INT32 *) opj_malloc((pNbComp + lNbMatCoeff) * sizeof(
            OPJ_INT32));
    if (! lCurrentData) {
        return OPJ_FALSE;
    }

    lCurrentMatrix = lCurrentData + pNbComp;

    for (i = 0; i < lNbMatCoeff; ++i) {
        lCurrentMatrix[i] = (OPJ_INT32)(*(lMct++) * (OPJ_FLOAT32)lMultiplicator);
    }

    for (i = 0; i < n; ++i)  {
        lMctPtr = lCurrentMatrix;
        for (j = 0; j < pNbComp; ++j) {
            lCurrentData[j] = (*(lData[j]));
        }

        for (j = 0; j < pNbComp; ++j) {
            *(lData[j]) = 0;
            for (k = 0; k < pNbComp; ++k) {
                *(lData[j]) += opj_int_fix_mul(*lMctPtr, lCurrentData[k]);
                ++lMctPtr;
            }

            ++lData[j];
        }
    }

    opj_free(lCurrentData);

    return OPJ_TRUE;
}